

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort_TEST.cpp
# Opt level: O0

void __thiscall
Valid_case_test_Sort_Sort_unit_test_Test::TestBody(Valid_case_test_Sort_Sort_unit_test_Test *this)

{
  bool bVar1;
  ulong uVar2;
  int *a_00;
  char *pcVar3;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_9;
  int i_5;
  int j_9;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_8;
  int i_4;
  int j_8;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_7;
  int i_3;
  int j_7;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_6;
  int i_2;
  int j_6;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_5;
  int i_1;
  int j_5;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  int j_4;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  int j_3;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  int j_2;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  int j_1;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  int j;
  int i;
  int *a;
  int n;
  Valid_case_test_Sort_Sort_unit_test_Test *this_local;
  
  uVar2 = SUB168(ZEXT816(5000) * ZEXT816(4),0);
  if (SUB168(ZEXT816(5000) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  a_00 = (int *)operator_new__(uVar2);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 5000;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    a_00[gtest_ar.message_.ptr_._4_4_] = gtest_ar.message_.ptr_._4_4_;
  }
  SelectionSort<int>(a_00,5000,Less<int>);
  gtest_ar.message_.ptr_._0_4_ = 0;
  while( true ) {
    if (4999 < (int)gtest_ar.message_.ptr_) {
      InsertionSort<int>(a_00,5000,1,Less<int>);
      gtest_ar_1.message_.ptr_._0_4_ = 0;
      while( true ) {
        if (4999 < (int)gtest_ar_1.message_.ptr_) {
          HeapSort<int>(a_00,5000,Less<int>);
          gtest_ar_2.message_.ptr_._4_4_ = 0;
          while( true ) {
            if (4999 < gtest_ar_2.message_.ptr_._4_4_) {
              QuickSort<int>(a_00,0,4999,Less<int>);
              gtest_ar_3.message_.ptr_._4_4_ = 0;
              while( true ) {
                if (4999 < gtest_ar_3.message_.ptr_._4_4_) {
                  MergeSort<int>(a_00,5000,Less<int>);
                  gtest_ar_4.message_.ptr_._4_4_ = 0;
                  while( true ) {
                    if (4999 < gtest_ar_4.message_.ptr_._4_4_) {
                      SelectionSort<int>(a_00,5000,Greater<int>);
                      gtest_ar_5.message_.ptr_._4_4_ = 4999;
                      gtest_ar_5.message_.ptr_._0_4_ = 0;
                      while( true ) {
                        if (4999 < (int)gtest_ar_5.message_.ptr_) {
                          InsertionSort<int>(a_00,5000,1,Greater<int>);
                          gtest_ar_6.message_.ptr_._4_4_ = 4999;
                          gtest_ar_6.message_.ptr_._0_4_ = 0;
                          while( true ) {
                            if (4999 < (int)gtest_ar_6.message_.ptr_) {
                              HeapSort<int>(a_00,5000,Greater<int>);
                              gtest_ar_7.message_.ptr_._4_4_ = 4999;
                              gtest_ar_7.message_.ptr_._0_4_ = 0;
                              while( true ) {
                                if (4999 < (int)gtest_ar_7.message_.ptr_) {
                                  QuickSort<int>(a_00,0,4999,Greater<int>);
                                  gtest_ar_8.message_.ptr_._4_4_ = 4999;
                                  gtest_ar_8.message_.ptr_._0_4_ = 0;
                                  while( true ) {
                                    if (4999 < (int)gtest_ar_8.message_.ptr_) {
                                      MergeSort<int>(a_00,5000,Greater<int>);
                                      gtest_ar_9.message_.ptr_._4_4_ = 4999;
                                      gtest_ar_9.message_.ptr_._0_4_ = 0;
                                      while( true ) {
                                        if (4999 < (int)gtest_ar_9.message_.ptr_) {
                                          if (a_00 != (int *)0x0) {
                                            operator_delete__(a_00);
                                          }
                                          return;
                                        }
                                        testing::internal::EqHelper<false>::Compare<int,int>
                                                  ((EqHelper<false> *)local_1b0,"j","a[i]",
                                                   (int *)((long)&gtest_ar_9.message_.ptr_ + 4),
                                                   a_00 + (int)gtest_ar_9.message_.ptr_);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_1b0);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_1b8);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_1b0);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_1c0,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                                  ,0x54,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_1c0,&local_1b8);
                                          testing::internal::AssertHelper::~AssertHelper(&local_1c0)
                                          ;
                                          testing::Message::~Message(&local_1b8);
                                        }
                                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_1b0);
                                        if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                                        gtest_ar_9.message_.ptr_._4_4_ =
                                             gtest_ar_9.message_.ptr_._4_4_ + -1;
                                        gtest_ar_9.message_.ptr_._0_4_ =
                                             (int)gtest_ar_9.message_.ptr_ + 1;
                                      }
                                      return;
                                    }
                                    testing::internal::EqHelper<false>::Compare<int,int>
                                              ((EqHelper<false> *)local_188,"j","a[i]",
                                               (int *)((long)&gtest_ar_8.message_.ptr_ + 4),
                                               a_00 + (int)gtest_ar_8.message_.ptr_);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_188);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_190);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_188);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&i_5,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                                 ,0x4f,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&i_5,&local_190);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&i_5);
                                      testing::Message::~Message(&local_190);
                                    }
                                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_188);
                                    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                                    gtest_ar_8.message_.ptr_._4_4_ =
                                         gtest_ar_8.message_.ptr_._4_4_ + -1;
                                    gtest_ar_8.message_.ptr_._0_4_ =
                                         (int)gtest_ar_8.message_.ptr_ + 1;
                                  }
                                  return;
                                }
                                testing::internal::EqHelper<false>::Compare<int,int>
                                          ((EqHelper<false> *)local_160,"j","a[i]",
                                           (int *)((long)&gtest_ar_7.message_.ptr_ + 4),
                                           a_00 + (int)gtest_ar_7.message_.ptr_);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_160);
                                if (!bVar1) {
                                  testing::Message::Message(&local_168);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_160);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&i_4,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                             ,0x4a,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&i_4,&local_168);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&i_4);
                                  testing::Message::~Message(&local_168);
                                }
                                gtest_ar_1.message_.ptr_._5_3_ = 0;
                                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_160);
                                if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                                gtest_ar_7.message_.ptr_._4_4_ = gtest_ar_7.message_.ptr_._4_4_ + -1
                                ;
                                gtest_ar_7.message_.ptr_._0_4_ = (int)gtest_ar_7.message_.ptr_ + 1;
                              }
                              return;
                            }
                            testing::internal::EqHelper<false>::Compare<int,int>
                                      ((EqHelper<false> *)local_138,"j","a[i]",
                                       (int *)((long)&gtest_ar_6.message_.ptr_ + 4),
                                       a_00 + (int)gtest_ar_6.message_.ptr_);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_138);
                            if (!bVar1) {
                              testing::Message::Message(&local_140);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_138);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&i_3,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                         ,0x45,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&i_3,&local_140);
                              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_3);
                              testing::Message::~Message(&local_140);
                            }
                            gtest_ar_1.message_.ptr_._5_3_ = 0;
                            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_138)
                            ;
                            if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                            gtest_ar_6.message_.ptr_._4_4_ = gtest_ar_6.message_.ptr_._4_4_ + -1;
                            gtest_ar_6.message_.ptr_._0_4_ = (int)gtest_ar_6.message_.ptr_ + 1;
                          }
                          return;
                        }
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  ((EqHelper<false> *)local_110,"j","a[i]",
                                   (int *)((long)&gtest_ar_5.message_.ptr_ + 4),
                                   a_00 + (int)gtest_ar_5.message_.ptr_);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_110);
                        if (!bVar1) {
                          testing::Message::Message(&local_118);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_110);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&i_2,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                     ,0x3c,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&i_2,&local_118);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
                          testing::Message::~Message(&local_118);
                        }
                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
                        if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                        gtest_ar_5.message_.ptr_._4_4_ = gtest_ar_5.message_.ptr_._4_4_ + -1;
                        gtest_ar_5.message_.ptr_._0_4_ = (int)gtest_ar_5.message_.ptr_ + 1;
                      }
                      return;
                    }
                    testing::internal::EqHelper<false>::Compare<int,int>
                              ((EqHelper<false> *)local_e8,"j","a[j]",
                               (int *)((long)&gtest_ar_4.message_.ptr_ + 4),
                               a_00 + gtest_ar_4.message_.ptr_._4_4_);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_f0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_e8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&i_1,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                                 ,0x31,pcVar3);
                      testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_f0);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
                      testing::Message::~Message(&local_f0);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
                    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                    gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1;
                  }
                  return;
                }
                testing::internal::EqHelper<false>::Compare<int,int>
                          ((EqHelper<false> *)local_c0,"j","a[j]",
                           (int *)((long)&gtest_ar_3.message_.ptr_ + 4),
                           a_00 + gtest_ar_3.message_.ptr_._4_4_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0)
                ;
                if (!bVar1) {
                  testing::Message::Message(&local_c8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff30,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                             ,0x2c,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xffffffffffffff30,&local_c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff30);
                  testing::Message::~Message(&local_c8);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
                if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
                gtest_ar_3.message_.ptr_._4_4_ = gtest_ar_3.message_.ptr_._4_4_ + 1;
              }
              return;
            }
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_98,"j","a[j]",
                       (int *)((long)&gtest_ar_2.message_.ptr_ + 4),
                       a_00 + gtest_ar_2.message_.ptr_._4_4_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
            if (!bVar1) {
              testing::Message::Message(&local_a0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                         ,0x27,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff58,&local_a0);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff58);
              testing::Message::~Message(&local_a0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
            if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
            gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1;
          }
          return;
        }
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_70,"j","a[j]",(int *)&gtest_ar_1.message_,
                   a_00 + (int)gtest_ar_1.message_.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
        if (!bVar1) {
          testing::Message::Message(&local_78);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x22,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff80,&local_78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
          testing::Message::~Message(&local_78);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
        if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
        gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1;
      }
      return;
    }
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_38,"j","a[j]",(int *)&gtest_ar.message_,
               a_00 + (int)gtest_ar.message_.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (!bVar1) {
      testing::Message::Message(local_50);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&j_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x19,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&j_1,local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_1);
      testing::Message::~Message(local_50);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1;
  }
  return;
}

Assistant:

TEST(Valid_case_test_Sort, Sort_unit_test){

    int n = 5000;
    int *a = new int[n];
    for (int i = 0; i < n; ++i) {
        a[i] = i;
    }

    /*
     * ALL SORT FOLLOW LESS
     */

    SelectionSort(a, n, Less);

    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    HeapSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    QuickSort(a, 0, n - 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    MergeSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    //---------------------------

    /*
     * ALL SORT FOLLOW GREATER
     */

    SelectionSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    HeapSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    QuickSort(a, 0,  n - 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    MergeSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    delete []a;
}